

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O1

Key * __thiscall
QProcessEnvironmentPrivate::prepareName
          (Key *__return_storage_ptr__,QProcessEnvironmentPrivate *this,QString *name)

{
  QMutex *this_00;
  uchar *puVar1;
  __pointer_type copy;
  Entry *pEVar2;
  Data *pDVar3;
  Data<QHashPrivate::Node<QString,_QByteArray>_> *data;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  uchar *puVar7;
  long in_FS_OFFSET;
  bool bVar8;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->nameMapMutex;
  if ((this->nameMapMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar8 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar8) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar8) goto LAB_0042c616;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_0042c616:
  QHash<QString,QByteArray>::tryEmplace_impl<QString_const&>
            (&local_50,(QHash<QString,QByteArray> *)&this->nameMap,name);
  pEVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
  uVar6 = (uint)(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                [(uint)local_50.iterator.i.bucket & 0x7f];
  puVar7 = (pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x18;
  if (*(long *)((pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x28) == 0) {
    QString::toLocal8Bit_helper((QByteArray *)&local_50,(QChar *)(name->d).ptr,(name->d).size);
    data = *(Data<QHashPrivate::Node<QString,_QByteArray>_> **)puVar7;
    *(Data<QHashPrivate::Node<QString,_QByteArray>_> **)puVar7 = local_50.iterator.i.d;
    uVar4 = *(ulong *)((pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x20);
    *(size_t *)((pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x20) = local_50.iterator.i.bucket;
    puVar1 = (pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x28;
    uVar5._0_1_ = (bool)puVar1[0];
    uVar5._1_1_ = puVar1[1];
    uVar5._2_1_ = puVar1[2];
    uVar5._3_1_ = puVar1[3];
    uVar5._4_1_ = puVar1[4];
    uVar5._5_1_ = puVar1[5];
    uVar5._6_1_ = puVar1[6];
    uVar5._7_1_ = puVar1[7];
    puVar1 = (pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x28;
    puVar1[0] = local_50.inserted;
    puVar1[1] = local_50._17_1_;
    puVar1[2] = local_50._18_1_;
    puVar1[3] = local_50._19_1_;
    puVar1[4] = local_50._20_1_;
    puVar1[5] = local_50._21_1_;
    puVar1[6] = local_50._22_1_;
    puVar1[7] = local_50._23_1_;
    local_50.iterator.i.d = data;
    local_50.iterator.i.bucket = uVar4;
    local_50._16_8_ = uVar5;
    if (data != (Data<QHashPrivate::Node<QString,_QByteArray>_> *)0x0) {
      LOCK();
      (data->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (data->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)data,1,0x10);
      }
    }
  }
  pDVar3 = *(Data **)puVar7;
  (__return_storage_ptr__->d).d = pDVar3;
  (__return_storage_ptr__->d).ptr =
       *(char **)((pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x20);
  (__return_storage_ptr__->d).size =
       *(qsizetype *)((pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x28);
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  LOCK();
  copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline Key prepareName(const QString &name) const
    {
        const NameMapMutexLocker locker(this);
        Key &ent = nameMap[name];
        if (ent.isEmpty())
            ent = name.toLocal8Bit();
        return ent;
    }